

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O2

int mbedtls_rsa_import(mbedtls_rsa_context *ctx,mbedtls_mpi *N,mbedtls_mpi *P,mbedtls_mpi *Q,
                      mbedtls_mpi *D,mbedtls_mpi *E)

{
  int iVar1;
  size_t sVar2;
  
  if (N == (mbedtls_mpi *)0x0) {
LAB_01f2b001:
    if (P != (mbedtls_mpi *)0x0) {
      iVar1 = mbedtls_mpi_copy(&ctx->P,P);
      if (iVar1 != 0) goto LAB_01f2b056;
    }
    if (Q != (mbedtls_mpi *)0x0) {
      iVar1 = mbedtls_mpi_copy(&ctx->Q,Q);
      if (iVar1 != 0) goto LAB_01f2b056;
    }
    if (D != (mbedtls_mpi *)0x0) {
      iVar1 = mbedtls_mpi_copy(&ctx->D,D);
      if (iVar1 != 0) goto LAB_01f2b056;
    }
    if (E != (mbedtls_mpi *)0x0) {
      iVar1 = mbedtls_mpi_copy(&ctx->E,E);
      if (iVar1 != 0) goto LAB_01f2b056;
    }
    iVar1 = 0;
    if (N != (mbedtls_mpi *)0x0) {
      sVar2 = mbedtls_mpi_size(&ctx->N);
      ctx->len = sVar2;
    }
  }
  else {
    iVar1 = mbedtls_mpi_copy(&ctx->N,N);
    if (iVar1 == 0) goto LAB_01f2b001;
LAB_01f2b056:
    iVar1 = iVar1 + -0x4080;
  }
  return iVar1;
}

Assistant:

int mbedtls_rsa_import(mbedtls_rsa_context *ctx,
                       const mbedtls_mpi *N,
                       const mbedtls_mpi *P, const mbedtls_mpi *Q,
                       const mbedtls_mpi *D, const mbedtls_mpi *E)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if ((N != NULL && (ret = mbedtls_mpi_copy(&ctx->N, N)) != 0) ||
        (P != NULL && (ret = mbedtls_mpi_copy(&ctx->P, P)) != 0) ||
        (Q != NULL && (ret = mbedtls_mpi_copy(&ctx->Q, Q)) != 0) ||
        (D != NULL && (ret = mbedtls_mpi_copy(&ctx->D, D)) != 0) ||
        (E != NULL && (ret = mbedtls_mpi_copy(&ctx->E, E)) != 0)) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_BAD_INPUT_DATA, ret);
    }

    if (N != NULL) {
        ctx->len = mbedtls_mpi_size(&ctx->N);
    }

    return 0;
}